

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O1

void __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>
::AddConstraint(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  NodeRange nr;
  CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>
  local_50;
  
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)this->converter_;
  paVar2 = &local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p == paVar1)
  {
    local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2 + 8
          );
    local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)paVar1;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] =
       '\0';
  local_50.super_FunctionalConstraint.result_var_ =
       (this->constr_).super_FunctionalConstraint.result_var_;
  local_50.super_FunctionalConstraint.ctx.value_ =
       (this->constr_).super_FunctionalConstraint.ctx.value_;
  local_50.super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>.args_.
  _M_elems = *&(this->constr_).
               super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>.
               args_._M_elems;
  local_50.super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>._8_1_ =
       (this->constr_).
       super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>.field_0x8;
  nr = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
       ::
       AddConstraintAndTryNoteResultVariable<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::DivId>>
                 ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                   *)this_00,&local_50);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AutoLink(this_00,nr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar2)
  {
    operator_delete(local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::IncrementVarUsage((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)this->converter_,(this->prepro_).result_var_);
  return;
}

Assistant:

void AddConstraint() {
    GetConverter().AddConstraint( std::move(GetConstraint()) );
    GetConverter().IncrementVarUsage(GetResultVar());   // ater adding the con
  }